

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::restartExpireTimer(QTipLabel *this,int msecDisplayTime)

{
  QLabelPrivate *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QLabel).super_QFrame.super_QWidget.field_0x8;
  bVar1 = QLabelPrivate::needTextControl(this_00);
  if (bVar1) {
    QWidgetTextControl::toPlainText((QString *)&local_40,(QWidgetTextControl *)this_00->control);
  }
  else {
    QLabel::text((QString *)&local_40,&this->super_QLabel);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  iVar2 = 100;
  if (100 < (ulong)local_40.size) {
    iVar2 = (int)local_40.size;
  }
  iVar2 = iVar2 * 0x28 + 6000;
  if (0 < msecDisplayTime) {
    iVar2 = msecDisplayTime;
  }
  QBasicTimer::start(&this->expireTimer,iVar2,(QObject *)this);
  QBasicTimer::stop();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::restartExpireTimer(int msecDisplayTime)
{
    Q_D(const QLabel);
    const qsizetype textLength = d->needTextControl() ? d->control->toPlainText().size() : text().size();
    qsizetype time = 10000 + 40 * qMax(0, textLength - 100);
    if (msecDisplayTime > 0)
        time = msecDisplayTime;
    expireTimer.start(time, this);
    hideTimer.stop();
}